

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

NodeRefPtr<4> __thiscall
embree::sse2::BVHBuilderBinnedFastSpatialSAH::
CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>::
operator()(CreateLeafExt<embree::NodeRefPtr<4>,embree::sse2::CreateLeafSpatial<4,embree::TriangleM<4>>>
           *this,PrimRef *prims,range<unsigned_long> *range,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  char *pcVar3;
  float fVar4;
  ThreadLocal2 *this_00;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  long lVar23;
  undefined1 *puVar24;
  ulong uVar25;
  float *pfVar26;
  ulong uVar27;
  long lVar28;
  vuint<4> vgeomID;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  
  uVar20 = range->_begin;
  puVar24 = (undefined1 *)((long)&prims[uVar20].lower.field_0 + 0xc);
  for (; uVar20 < range->_end; uVar20 = uVar20 + 1) {
    puVar24[3] = puVar24[3] & 7;
    puVar24 = puVar24 + 0x20;
  }
  uVar20 = range->_begin;
  uVar25 = (range->_end - uVar20) + 3 >> 2;
  vgeomID.field_0.v[0] = uVar25 * 0xb0;
  this_00 = (alloc.talloc1)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    v1.field_0._8_1_ = 1;
    v1.field_0._0_8_ = this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_00->alloc0).bytesUsed = 0;
    (this_00->alloc0).bytesWasted = 0;
    (this_00->alloc0).end = 0;
    (this_00->alloc0).allocBlockSize = 0;
    (this_00->alloc0).ptr = (char *)0x0;
    (this_00->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)0x0;
      (this_00->alloc1).cur = 0;
      (this_00->alloc1).end = 0;
      (this_00->alloc1).allocBlockSize = 0;
      (this_00->alloc1).bytesUsed = 0;
      (this_00->alloc1).bytesWasted = 0;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    v0.field_0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    v0.field_0._8_1_ = 1;
    v2.field_0._0_8_ = this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&v2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v0);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
  }
  uVar17 = vgeomID.field_0.v[0];
  (alloc.talloc1)->bytesUsed = (alloc.talloc1)->bytesUsed + vgeomID.field_0.v[0];
  sVar21 = (alloc.talloc1)->cur;
  uVar22 = (ulong)(-(int)sVar21 & 0xf);
  uVar18 = sVar21 + vgeomID.field_0.v[0] + uVar22;
  (alloc.talloc1)->cur = uVar18;
  if ((alloc.talloc1)->end < uVar18) {
    (alloc.talloc1)->cur = sVar21;
    uVar18 = (alloc.talloc1)->allocBlockSize;
    if ((ulong)(vgeomID.field_0.v[0] * 4) < uVar18 || vgeomID.field_0.v[0] * 4 - uVar18 == 0) {
      v0.field_0._0_8_ = uVar18;
      pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
      (alloc.talloc1)->ptr = pcVar19;
      sVar21 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
      (alloc.talloc1)->bytesWasted = sVar21;
      (alloc.talloc1)->end = v0.field_0._0_8_;
      (alloc.talloc1)->cur = uVar17;
      if ((ulong)v0.field_0._0_8_ < (ulong)uVar17) {
        (alloc.talloc1)->cur = 0;
        v0.field_0._0_8_ = (alloc.talloc1)->allocBlockSize;
        pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&v0);
        (alloc.talloc1)->ptr = pcVar19;
        sVar21 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar21;
        (alloc.talloc1)->end = v0.field_0._0_8_;
        (alloc.talloc1)->cur = uVar17;
        if ((ulong)v0.field_0._0_8_ < (ulong)uVar17) {
          (alloc.talloc1)->cur = 0;
          pcVar19 = (char *)0x0;
          goto LAB_0048aad3;
        }
      }
      (alloc.talloc1)->bytesWasted = sVar21;
    }
    else {
      pcVar19 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&vgeomID);
    }
  }
  else {
    (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar22;
    pcVar19 = (alloc.talloc1)->ptr + (uVar18 - vgeomID.field_0._0_8_);
  }
LAB_0048aad3:
  for (uVar18 = 0; uVar18 != uVar25; uVar18 = uVar18 + 1) {
    uVar22 = range->_end;
    lVar23 = *(long *)(*(long *)this + 0x68);
    vgeomID.field_0.v[0] = -1;
    vgeomID.field_0.i[2] = 0xffffffff;
    vgeomID.field_0.i[3] = 0xffffffff;
    vprimID.field_0.i[0] = 0xffffffff;
    vprimID.field_0.i[1] = 0xffffffff;
    vprimID.field_0.i[2] = 0xffffffff;
    vprimID.field_0.i[3] = 0xffffffff;
    v0.field_0._32_8_ = 0;
    v0.field_0._40_8_ = 0;
    v0.field_0._16_8_ = 0;
    v0.field_0._24_8_ = 0;
    v0.field_0._0_8_ = 0;
    v0.field_0._8_8_ = 0;
    v1.field_0._32_8_ = 0;
    v1.field_0._40_8_ = 0;
    v1.field_0._16_8_ = 0;
    v1.field_0._24_8_ = 0;
    v1.field_0._0_8_ = 0;
    v1.field_0._8_8_ = 0;
    v2.field_0._32_8_ = 0;
    v2.field_0._40_8_ = 0;
    v2.field_0._16_8_ = 0;
    v2.field_0._24_8_ = 0;
    v2.field_0._0_8_ = 0;
    v2.field_0._8_8_ = 0;
    pfVar26 = prims[uVar20].upper.field_0.m128 + 3;
    for (uVar27 = 0; (uVar27 < 4 && (uVar20 + uVar27 < uVar22)); uVar27 = uVar27 + 1) {
      fVar4 = *pfVar26;
      lVar5 = *(long *)(*(long *)(lVar23 + 0x1e8) + (ulong)(uint)pfVar26[-4] * 8);
      lVar28 = (ulong)(uint)fVar4 * *(long *)(lVar5 + 0x68);
      lVar6 = *(long *)(lVar5 + 0x58);
      lVar7 = *(long *)(lVar5 + 0x90);
      lVar5 = *(long *)(lVar5 + 0xa0);
      puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + lVar28) * lVar5);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      uVar10 = puVar2[2];
      puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 4 + lVar28) * lVar5);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      uVar13 = puVar2[2];
      puVar2 = (undefined4 *)(lVar7 + (ulong)*(uint *)(lVar6 + 8 + lVar28) * lVar5);
      uVar14 = *puVar2;
      uVar15 = puVar2[1];
      uVar16 = puVar2[2];
      vgeomID.field_0.i[uVar27] = (uint)pfVar26[-4];
      vprimID.field_0.i[uVar27] = (uint)fVar4;
      *(undefined4 *)((long)&v0.field_0 + uVar27 * 4) = uVar8;
      *(undefined4 *)((long)&v0.field_0 + uVar27 * 4 + 0x10) = uVar9;
      *(undefined4 *)((long)&v0.field_0 + uVar27 * 4 + 0x20) = uVar10;
      *(undefined4 *)((long)&v1.field_0 + uVar27 * 4) = uVar11;
      *(undefined4 *)((long)&v1.field_0 + uVar27 * 4 + 0x10) = uVar12;
      *(undefined4 *)((long)&v1.field_0 + uVar27 * 4 + 0x20) = uVar13;
      *(undefined4 *)((long)&v2.field_0 + uVar27 * 4) = uVar14;
      *(undefined4 *)((long)&v2.field_0 + uVar27 * 4 + 0x10) = uVar15;
      *(undefined4 *)((long)&v2.field_0 + uVar27 * 4 + 0x20) = uVar16;
      pfVar26 = pfVar26 + 8;
    }
    lVar23 = uVar18 * 0xb0;
    pcVar3 = pcVar19 + lVar23;
    *(undefined4 *)pcVar3 = v0.field_0._0_4_;
    *(undefined4 *)(pcVar3 + 4) = v0.field_0._4_4_;
    *(undefined4 *)(pcVar3 + 8) = v0.field_0._8_4_;
    *(undefined4 *)(pcVar3 + 0xc) = v0.field_0._12_4_;
    pcVar3 = pcVar19 + lVar23 + 0x10;
    *(undefined4 *)pcVar3 = v0.field_0._16_4_;
    *(undefined4 *)(pcVar3 + 4) = v0.field_0._20_4_;
    *(undefined4 *)(pcVar3 + 8) = v0.field_0._24_4_;
    *(undefined4 *)(pcVar3 + 0xc) = v0.field_0._28_4_;
    pcVar3 = pcVar19 + lVar23 + 0x20;
    *(undefined4 *)pcVar3 = v0.field_0._32_4_;
    *(undefined4 *)(pcVar3 + 4) = v0.field_0._36_4_;
    *(undefined4 *)(pcVar3 + 8) = v0.field_0._40_4_;
    *(undefined4 *)(pcVar3 + 0xc) = v0.field_0._44_4_;
    pfVar26 = (float *)(pcVar19 + lVar23 + 0x30);
    *pfVar26 = (float)v0.field_0._0_4_ - (float)v1.field_0._0_4_;
    pfVar26[1] = (float)v0.field_0._4_4_ - (float)v1.field_0._4_4_;
    pfVar26[2] = (float)v0.field_0._8_4_ - (float)v1.field_0._8_4_;
    pfVar26[3] = (float)v0.field_0._12_4_ - (float)v1.field_0._12_4_;
    pfVar26 = (float *)(pcVar19 + lVar23 + 0x40);
    *pfVar26 = (float)v0.field_0._16_4_ - (float)v1.field_0._16_4_;
    pfVar26[1] = (float)v0.field_0._20_4_ - (float)v1.field_0._20_4_;
    pfVar26[2] = (float)v0.field_0._24_4_ - (float)v1.field_0._24_4_;
    pfVar26[3] = (float)v0.field_0._28_4_ - (float)v1.field_0._28_4_;
    pfVar26 = (float *)(pcVar19 + lVar23 + 0x50);
    *pfVar26 = (float)v0.field_0._32_4_ - (float)v1.field_0._32_4_;
    pfVar26[1] = (float)v0.field_0._36_4_ - (float)v1.field_0._36_4_;
    pfVar26[2] = (float)v0.field_0._40_4_ - (float)v1.field_0._40_4_;
    pfVar26[3] = (float)v0.field_0._44_4_ - (float)v1.field_0._44_4_;
    pfVar26 = (float *)(pcVar19 + lVar23 + 0x60);
    *pfVar26 = (float)v2.field_0._0_4_ - (float)v0.field_0._0_4_;
    pfVar26[1] = (float)v2.field_0._4_4_ - (float)v0.field_0._4_4_;
    pfVar26[2] = (float)v2.field_0._8_4_ - (float)v0.field_0._8_4_;
    pfVar26[3] = (float)v2.field_0._12_4_ - (float)v0.field_0._12_4_;
    pfVar26 = (float *)(pcVar19 + lVar23 + 0x70);
    *pfVar26 = (float)v2.field_0._16_4_ - (float)v0.field_0._16_4_;
    pfVar26[1] = (float)v2.field_0._20_4_ - (float)v0.field_0._20_4_;
    pfVar26[2] = (float)v2.field_0._24_4_ - (float)v0.field_0._24_4_;
    pfVar26[3] = (float)v2.field_0._28_4_ - (float)v0.field_0._28_4_;
    pfVar26 = (float *)(pcVar19 + lVar23 + 0x80);
    *pfVar26 = (float)v2.field_0._32_4_ - (float)v0.field_0._32_4_;
    pfVar26[1] = (float)v2.field_0._36_4_ - (float)v0.field_0._36_4_;
    pfVar26[2] = (float)v2.field_0._40_4_ - (float)v0.field_0._40_4_;
    pfVar26[3] = (float)v2.field_0._44_4_ - (float)v0.field_0._44_4_;
    *(longlong *)(pcVar19 + lVar23 + 0x90) = vgeomID.field_0.v[0];
    *(longlong *)((long)(pcVar19 + lVar23 + 0x90) + 8) =
         CONCAT44(vgeomID.field_0.i[3],vgeomID.field_0.i[2]);
    *(ulong *)(pcVar19 + lVar23 + 0xa0) = CONCAT44(vprimID.field_0.i[1],vprimID.field_0.i[0]);
    *(ulong *)(pcVar19 + lVar23 + 0xa0 + 8) = CONCAT44(vprimID.field_0.i[3],vprimID.field_0.i[2]);
    uVar20 = uVar20 + uVar27;
  }
  uVar20 = 7;
  if (uVar25 < 7) {
    uVar20 = uVar25;
  }
  return (NodeRefPtr<4>)(uVar20 | (ulong)pcVar19 | 8);
}

Assistant:

__noinline ReductionTy operator() (PrimRef* prims, const range<size_t>& range, Allocator alloc) const
        {
          for (size_t i=range.begin(); i<range.end(); i++)
            prims[i].lower.u &= GEOMID_MASK;

          return userCreateLeaf(prims,range,alloc);
        }